

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds)

{
  ulong uVar1;
  tm *ptVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  time_t Julian;
  int in_stack_00000010;
  long local_10;
  
  uVar6 = Year + 0x76c;
  if (99 < (ulong)Year) {
    uVar6 = Year;
  }
  if (Year < 0x45) {
    uVar6 = Year + 2000;
  }
  if ((uVar6 & 3) == 0) {
    if ((long)uVar6 % 100 == 0) {
      Convert::DaysInMonth[1] = ((long)uVar6 % 400 == 0) + 0x1c;
    }
    else {
      Convert::DaysInMonth[1] = 0x1d;
    }
  }
  else {
    Convert::DaysInMonth[1] = 0x1c;
  }
  local_10 = -1;
  if (((((0 < Day) && (0xfffffffffffffff3 < Month - 0xdU)) && (0xffffffffffffffba < uVar6 - 0x7f7))
      && (((ulong)Seconds < 0x3c && ((ulong)Minutes < 0x3c)))) &&
     (((ulong)Hours < 0x18 &&
      (piVar3 = Convert::DaysInMonth, Day <= *(int *)(&DAT_001885cc + Month * 4))))) {
    lVar5 = Month + -1;
    lVar4 = Day + -1;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      lVar4 = lVar4 + *piVar3;
      piVar3 = piVar3 + 1;
    }
    for (uVar1 = 0x7b2; uVar6 != uVar1; uVar1 = uVar1 + 1) {
      lVar4 = lVar4 + 0x16d + (ulong)((uVar1 & 3) == 0);
    }
    local_10 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Julian + lVar4 * 0x15180;
    if ((in_stack_00000010 == 0) ||
       ((in_stack_00000010 == 2 && (ptVar2 = localtime(&local_10), ptVar2->tm_isdst != 0)))) {
      local_10 = local_10 + -0xe10;
    }
  }
  return local_10;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	static int DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}